

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

string * __thiscall helics::InputInfo::getInjectionUnits_abi_cxx11_(InputInfo *this)

{
  string *this_00;
  pointer psVar1;
  size_t sVar2;
  size_t __n;
  pointer psVar3;
  InputInfo *pIVar4;
  int iVar5;
  bool bVar6;
  pointer psVar7;
  pointer psVar8;
  bool bVar9;
  string_t local_68;
  InputInfo *local_48;
  data local_40;
  
  this_00 = &this->inputUnits;
  if ((this->inputUnits)._M_string_length == 0) {
    psVar7 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar7 != psVar1) {
      sVar2 = (psVar7->units)._M_string_length;
      bVar6 = true;
      psVar3 = psVar7;
      local_48 = this;
      do {
        psVar8 = psVar3 + 1;
        __n = (psVar3->units)._M_string_length;
        if (__n == sVar2) {
          if (__n == 0) {
            bVar9 = true;
          }
          else {
            iVar5 = bcmp((psVar3->units)._M_dataplus._M_p,(psVar7->units)._M_dataplus._M_p,__n);
            bVar9 = iVar5 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if (!bVar9) {
          bVar6 = false;
          break;
        }
        psVar3 = psVar8;
      } while (psVar8 != psVar1);
      if (bVar6) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &psVar7->units);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        pIVar4 = local_48;
        psVar7 = (local_48->source_info).
                 super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (local_48->source_info).
                 super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar7 != psVar1) {
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_40,&psVar7->units);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_68,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_40);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      local_68._M_dataplus._M_p,local_68._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      ',');
            psVar7 = psVar7 + 1;
          } while (psVar7 != psVar1);
        }
        (pIVar4->inputUnits)._M_dataplus._M_p[(pIVar4->inputUnits)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& InputInfo::getInjectionUnits() const
{
    if (inputUnits.empty()) {
        if (!source_info.empty()) {
            bool allTheSame{true};
            for (const auto& src : source_info) {
                if (src.units != source_info.front().units) {
                    allTheSame = false;
                    break;
                }
            }
            if (allTheSame) {
                inputUnits = source_info.front().units;
            } else {
                inputUnits.push_back('[');
                for (const auto& src : source_info) {
                    inputUnits.append(generateJsonQuotedString(src.units));
                    inputUnits.push_back(',');
                }
                inputUnits.back() = ']';
            }
        }
    }
    return inputUnits;
}